

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoPrism>::Write
          (TPZGeoElRefLess<pzgeom::TPZGeoPrism> *this,TPZStream *buf,int withclassid)

{
  undefined4 in_EDX;
  undefined8 in_RSI;
  TPZGeoPrism *in_RDI;
  int64_t *piVar1;
  TPZGeoEl *unaff_retaddr;
  uint i;
  TPZStream *in_stack_ffffffffffffffd8;
  uint local_18;
  
  TPZGeoEl::Write(unaff_retaddr,(TPZStream *)in_RDI,(int)((ulong)in_RSI >> 0x20));
  pzgeom::TPZGeoPrism::Write(in_RDI,in_stack_ffffffffffffffd8,0);
  for (local_18 = 0; local_18 < 0x15; local_18 = local_18 + 1) {
    piVar1 = in_RDI[2].super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes + (ulong)local_18 * 3;
    (**(code **)(*piVar1 + 0x28))(piVar1,in_RSI,in_EDX);
  }
  return;
}

Assistant:

void TPZGeoElRefLess<TGeo>::Write(TPZStream &buf, int withclassid) const {
    TPZGeoEl::Write(buf, withclassid);
    fGeo.Write(buf, withclassid);
    for (unsigned int i = 0; i < TGeo::NSides; ++i) {
        this->fNeighbours[i].Write(buf, withclassid);
    }
}